

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawEllipse(int centerX,int centerY,float radiusH,float radiusV,Color color)

{
  uint uVar1;
  uint uVar2;
  float x;
  float y;
  float fVar3;
  float fVar4;
  
  rlBegin(4);
  x = (float)centerX;
  y = (float)centerY;
  uVar2 = 0xfffffff6;
  do {
    uVar1 = uVar2 + 10;
    rlColor4ub(color.r,color.g,color.b,color.a);
    rlVertex2f(x,y);
    fVar4 = (float)(int)(uVar2 + 0x14) * 0.017453292;
    fVar3 = cosf(fVar4);
    fVar4 = sinf(fVar4);
    rlVertex2f(fVar3 * radiusH + x,fVar4 * radiusV + y);
    fVar3 = cosf((float)(int)uVar1 * 0.017453292);
    fVar4 = sinf((float)(int)uVar1 * 0.017453292);
    rlVertex2f(fVar3 * radiusH + x,fVar4 * radiusV + y);
    uVar2 = uVar1;
  } while (uVar1 < 0x15e);
  rlEnd();
  return;
}

Assistant:

void DrawEllipse(int centerX, int centerY, float radiusH, float radiusV, Color color)
{
    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < 360; i += 10)
        {
            rlColor4ub(color.r, color.g, color.b, color.a);
            rlVertex2f((float)centerX, (float)centerY);
            rlVertex2f((float)centerX + cosf(DEG2RAD*(i + 10))*radiusH, (float)centerY + sinf(DEG2RAD*(i + 10))*radiusV);
            rlVertex2f((float)centerX + cosf(DEG2RAD*i)*radiusH, (float)centerY + sinf(DEG2RAD*i)*radiusV);
        }
    rlEnd();
}